

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O2

iterator __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Descriptor_const*>,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<google::protobuf::Descriptor_const*>>
::find_soo<google::protobuf::Descriptor_const*>
          (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Descriptor_const*>,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<google::protobuf::Descriptor_const*>>
           *this,key_arg<const_google::protobuf::Descriptor_*> *key)

{
  undefined1 auVar1 [16];
  bool bVar2;
  slot_type *ppDVar3;
  ulong extraout_RDX;
  iterator iVar4;
  
  bVar2 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::Descriptor_*>_>
          ::is_soo((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::Descriptor_*>_>
                    *)this);
  if (!bVar2) {
    __assert_fail("(is_soo()) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xe21,
                  "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::Descriptor *>, absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Hash, absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Eq, std::allocator<const google::protobuf::Descriptor *>>::find_soo(const key_arg<K> &) [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::Descriptor *>, Hash = absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Hash, Eq = absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Eq, Alloc = std::allocator<const google::protobuf::Descriptor *>, K = const google::protobuf::Descriptor *]"
                 );
  }
  bVar2 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::Descriptor_*>_>
          ::empty((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::Descriptor_*>_>
                   *)this);
  if (!bVar2) {
    ppDVar3 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::Descriptor_*>_>
              ::soo_slot((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::Descriptor_*>_>
                          *)this);
    if (*ppDVar3 == *key) {
      iVar4 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::Descriptor_*>_>
              ::soo_iterator((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::Descriptor_*>_>
                              *)this);
      return iVar4;
    }
  }
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::Descriptor_*>_>
  ::AssertNotDebugCapacity
            ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::Descriptor_*>_>
              *)this);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = extraout_RDX;
  return (iterator)(auVar1 << 0x40);
}

Assistant:

iterator find_soo(const key_arg<K>& key) {
    ABSL_SWISSTABLE_ASSERT(is_soo());
    return empty() || !PolicyTraits::apply(EqualElement<K>{key, eq_ref()},
                                           PolicyTraits::element(soo_slot()))
               ? end()
               : soo_iterator();
  }